

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_519a2::Json2Array<aliyun::DrdsDescribeDrdsInstancesVipType>::Json2Array
          (Json2Array<aliyun::DrdsDescribeDrdsInstancesVipType> *this,Value *value,
          vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_88 [8];
  DrdsDescribeDrdsInstancesVipType val;
  int i;
  vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::DrdsDescribeDrdsInstancesVipType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.type.field_2._12_4_ = 0; uVar1 = val.type.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.type.field_2._12_4_ = val.type.field_2._12_4_ + 1) {
      aliyun::DrdsDescribeDrdsInstancesVipType::DrdsDescribeDrdsInstancesVipType
                ((DrdsDescribeDrdsInstancesVipType *)local_88);
      value_00 = Json::Value::operator[](value,val.type.field_2._12_4_);
      anon_unknown.dwarf_519a2::Json2Type(value_00,(DrdsDescribeDrdsInstancesVipType *)local_88);
      std::
      vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
      ::push_back(vec,(value_type *)local_88);
      aliyun::DrdsDescribeDrdsInstancesVipType::~DrdsDescribeDrdsInstancesVipType
                ((DrdsDescribeDrdsInstancesVipType *)local_88);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }